

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# farmhash.cc
# Opt level: O0

uint128_t farmhashcc::CityHash128(char *s,size_t len)

{
  uint64_t uVar1;
  ulong in_RSI;
  char *in_RDI;
  size_t in_stack_000000e8;
  char *in_stack_000000f0;
  undefined1 in_stack_000000f8 [16];
  pair<unsigned_long,_unsigned_long> local_50;
  unsigned_long local_40;
  uint64_t local_38;
  pair<unsigned_long,_unsigned_long> local_30;
  char *local_18;
  uint128_t local_10;
  
  if (in_RSI < 0x10) {
    std::pair<unsigned_long,_unsigned_long>::pair<unsigned_long,_unsigned_long,_true>
              (&local_50,&util::k0,&util::k1);
    local_10 = CityHash128WithSeed(in_stack_000000f0,in_stack_000000e8,(uint128_t)in_stack_000000f8)
    ;
  }
  else {
    local_18 = in_RDI;
    local_38 = util::Fetch64(in_RDI);
    uVar1 = util::Fetch64(local_18 + 8);
    local_40 = uVar1 + 0xc3a5c85c97cb3127;
    std::pair<unsigned_long,_unsigned_long>::pair<unsigned_long,_unsigned_long,_true>
              (&local_30,&local_38,&local_40);
    local_10 = CityHash128WithSeed(in_stack_000000f0,in_stack_000000e8,(uint128_t)in_stack_000000f8)
    ;
  }
  return local_10;
}

Assistant:

STATIC_INLINE uint128_t CityHash128(const char *s, size_t len) {
  return len >= 16 ?
      CityHash128WithSeed(s + 16, len - 16,
                          uint128_t(Fetch(s), Fetch(s + 8) + k0)) :
      CityHash128WithSeed(s, len, uint128_t(k0, k1));
}